

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptrlist.c
# Opt level: O2

void ptrlist_split_node(ptr_list *head)

{
  char cVar1;
  allocator *A;
  ptr_list *ppVar2;
  char cVar3;
  ptr_list *ppVar4;
  int iVar5;
  
  A = head->allocator_;
  if (A != (allocator *)0x0) {
    cVar1 = *(char *)head;
    cVar3 = cVar1 / '\x02';
    ppVar4 = (ptr_list *)dmrC_allocator_allocate(A,0);
    ppVar2 = head->next_;
    ppVar4->allocator_ = A;
    iVar5 = (int)cVar1 - (int)cVar3;
    *(char *)head = (char)iVar5;
    ppVar4->next_ = ppVar2;
    ppVar2->prev_ = ppVar4;
    ppVar4->prev_ = head;
    head->next_ = ppVar4;
    *(char *)ppVar4 = cVar3;
    memcpy(ppVar4->list_,head->list_ + iVar5,(long)cVar3 << 3);
    memset(head->list_ + iVar5,0xf0,(long)cVar3 << 3);
    return;
  }
  __assert_fail("alloc",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]dmr_c/src/ptrlist.c"
                ,0x1d,"void ptrlist_split_node(struct ptr_list *)");
}

Assistant:

void ptrlist_split_node(struct ptr_list *head)
{
	int old = head->nr_, nr = old / 2;
	struct allocator *alloc = head->allocator_;
	assert(alloc);
	struct ptr_list *newlist =
	    (struct ptr_list *)dmrC_allocator_allocate(alloc, 0);
	struct ptr_list *next = head->next_;
	newlist->allocator_ = alloc;

	old -= nr;
	head->nr_ = old;
	newlist->next_ = next;
	next->prev_ = newlist;
	newlist->prev_ = head;
	head->next_ = newlist;
	newlist->nr_ = nr;
	memcpy(newlist->list_, head->list_ + old, nr * sizeof(void *));
	memset(head->list_ + old, 0xf0, nr * sizeof(void *));
}